

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha224.c
# Opt level: O2

int SHA256Input(SHA256Context *context,uint8_t *message_array,uint length)

{
  uint32_t *puVar1;
  uint8_t uVar2;
  short sVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  
  if (length == 0) {
    return 0;
  }
  if (message_array == (uint8_t *)0x0 || context == (SHA256Context *)0x0) {
    iVar5 = 1;
  }
  else if (context->Computed == 0) {
    iVar5 = context->Corrupted;
    if (iVar5 == 0) {
      iVar5 = 0;
      do {
        iVar6 = -length;
        while( true ) {
          iVar6 = iVar6 + 1;
          if (iVar6 == 1) {
            return iVar5;
          }
          if (iVar5 != 0) {
            return iVar5;
          }
          sVar3 = context->Message_Block_Index;
          if ((long)sVar3 < 0x40) break;
          context->Corrupted = 4;
          iVar5 = 4;
        }
        uVar2 = *message_array;
        context->Message_Block_Index = sVar3 + 1;
        context->Message_Block[sVar3] = uVar2;
        uVar4 = context->Length_Low;
        context->Length_Low = uVar4 + 8;
        if (uVar4 < 0xfffffff8) {
          context->Corrupted = 0;
LAB_0018542f:
          iVar5 = 0;
          if (context->Message_Block_Index == 0x40) {
            SHA224_256ProcessMessageBlock(context);
            iVar5 = context->Corrupted;
          }
        }
        else {
          puVar1 = &context->Length_High;
          *puVar1 = *puVar1 + 1;
          context->Corrupted = (uint)(*puVar1 == 0);
          iVar5 = 1;
          if (*puVar1 != 0) goto LAB_0018542f;
        }
        length = -iVar6;
        message_array = message_array + 1;
      } while( true );
    }
  }
  else {
    context->Corrupted = 3;
    iVar5 = 3;
  }
  return iVar5;
}

Assistant:

int SHA256Input(SHA256Context *context, const uint8_t *message_array, unsigned int length)
{
    int result;
    uint32_t addTemp;
    if (!length)
    {
        result = shaSuccess;
    }
    else if (!context || !message_array)
    {
        result = shaNull;
    }
    else if (context->Computed)
    {
        result = context->Corrupted = shaStateError;
    }
    else if (context->Corrupted)
    {
        result = context->Corrupted;
    }
    else
    {
        while (length-- && !context->Corrupted)
        {
            if (context->Message_Block_Index < SHA256_Message_Block_Size)
            {
                context->Message_Block[context->Message_Block_Index++] = (*message_array & 0xFF);

                if (!SHA224_256AddLength(context, 8) && (context->Message_Block_Index == SHA256_Message_Block_Size))
                {
                    SHA224_256ProcessMessageBlock(context);
                }
                message_array++;
            }
            else
            {
                result = context->Corrupted = shaBadParam;
            }
        }
        result = context->Corrupted;
    }
    return result;
}